

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O0

string * __thiscall
cmCryptoHash::HashFile(string *__return_storage_ptr__,cmCryptoHash *this,string *file)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  allocator local_125d;
  uint local_125c;
  char **ppcStack_1258;
  int gcount;
  uchar *buffer_uc;
  char *buffer_c;
  cm_sha2_uint64_t buffer [512];
  allocator local_235 [13];
  long local_228;
  ifstream fin;
  string *file_local;
  cmCryptoHash *this_local;
  
  pcVar4 = (char *)std::__cxx11::string::c_str();
  _Var3 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(&local_228,pcVar4,_Var3);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) == 0) {
    (*this->_vptr_cmCryptoHash[2])();
    buffer_uc = (uchar *)&buffer_c;
    ppcStack_1258 = &buffer_c;
    while (bVar2 = std::ios::operator_cast_to_bool
                             ((ios *)((long)&local_228 + *(long *)(local_228 + -0x18))), bVar2) {
      std::istream::read((char *)&local_228,(long)buffer_uc);
      local_125c = std::istream::gcount();
      if (local_125c != 0) {
        (*this->_vptr_cmCryptoHash[3])(this,ppcStack_1258,(ulong)local_125c);
      }
    }
    bVar1 = std::ios::eof();
    if ((bVar1 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_125d);
      std::allocator<char>::~allocator((allocator<char> *)&local_125d);
    }
    else {
      (*this->_vptr_cmCryptoHash[4])(__return_storage_ptr__);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_235);
    std::allocator<char>::~allocator((allocator<char> *)local_235);
  }
  std::ifstream::~ifstream(&local_228);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCryptoHash::HashFile(const std::string& file)
{
  cmsys::ifstream fin(file.c_str(), std::ios::in | std::ios::binary);
  if(!fin)
    {
    return "";
    }

  this->Initialize();

  // Should be efficient enough on most system:
  cm_sha2_uint64_t buffer[512];
  char* buffer_c = reinterpret_cast<char*>(buffer);
  unsigned char const* buffer_uc =
    reinterpret_cast<unsigned char const*>(buffer);
  // This copy loop is very sensitive on certain platforms with
  // slightly broken stream libraries (like HPUX).  Normally, it is
  // incorrect to not check the error condition on the fin.read()
  // before using the data, but the fin.gcount() will be zero if an
  // error occurred.  Therefore, the loop should be safe everywhere.
  while(fin)
    {
    fin.read(buffer_c, sizeof(buffer));
    if(int gcount = static_cast<int>(fin.gcount()))
      {
      this->Append(buffer_uc, gcount);
      }
    }
  if(fin.eof())
    {
    return this->Finalize();
    }
  return "";
}